

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

int32_t __thiscall
absl::synchronization_internal::anon_unknown_0::PointerMap::Remove(PointerMap *this,void *ptr)

{
  Node *pNVar1;
  uint32_t uVar2;
  uintptr_t uVar3;
  Node **ppNVar4;
  Node *n;
  int32_t *piStack_30;
  int32_t index;
  int32_t *slot;
  uintptr_t masked;
  void *ptr_local;
  PointerMap *this_local;
  
  uVar3 = base_internal::HidePtr<void>(ptr);
  uVar2 = Hash(ptr);
  piStack_30 = std::array<int,_8171UL>::operator[](&this->table_,(ulong)uVar2);
  while( true ) {
    if (*piStack_30 == 0xffffffff) {
      return -1;
    }
    uVar2 = *piStack_30;
    ppNVar4 = Vec<absl::synchronization_internal::(anonymous_namespace)::Node_*>::operator[]
                        (this->nodes_,uVar2);
    pNVar1 = *ppNVar4;
    if (pNVar1->masked_ptr == uVar3) break;
    piStack_30 = &pNVar1->next_hash;
  }
  *piStack_30 = pNVar1->next_hash;
  pNVar1->next_hash = -1;
  return uVar2;
}

Assistant:

int32_t Remove(void* ptr) {
    // Advance through linked list while keeping track of the
    // predecessor slot that points to the current entry.
    auto masked = base_internal::HidePtr(ptr);
    for (int32_t* slot = &table_[Hash(ptr)]; *slot != -1; ) {
      int32_t index = *slot;
      Node* n = (*nodes_)[index];
      if (n->masked_ptr == masked) {
        *slot = n->next_hash;  // Remove n from linked list
        n->next_hash = -1;
        return index;
      }
      slot = &n->next_hash;
    }
    return -1;
  }